

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktWsiSurfaceTests.cpp
# Opt level: O2

TestStatus *
vkt::wsi::anon_unknown_0::createSurfaceCustomAllocatorTest
          (TestStatus *__return_storage_ptr__,Context *context,Type wsiType)

{
  TestLog *log;
  bool bVar1;
  VkAllocationCallbacks *pVVar2;
  allocator<char> local_2a9;
  NativeObjects native;
  string local_288;
  RefBase<vk::Handle<(vk::HandleType)25>_> local_268;
  AllocationCallbackRecorder allocationRecorder;
  InstanceHelper instHelper;
  
  pVVar2 = ::vk::getSystemAllocator();
  ::vk::AllocationCallbackRecorder::AllocationCallbackRecorder(&allocationRecorder,pVVar2,0x400);
  log = context->m_testCtx->m_log;
  pVVar2 = &allocationRecorder.super_ChainedAllocator.super_AllocationCallbacks.m_callbacks;
  InstanceHelper::InstanceHelper(&instHelper,context,wsiType,pVVar2);
  local_268.m_data.object.m_internal = 0;
  NativeObjects::NativeObjects
            (&native,context,&instHelper.supportedExtensions,wsiType,
             (Maybe<tcu::Vector<unsigned_int,_2>_> *)&local_268);
  ::vk::wsi::createSurface
            ((Move<vk::Handle<(vk::HandleType)25>_> *)&local_288,
             &instHelper.vki.super_InstanceInterface,
             instHelper.instance.super_RefBase<vk::VkInstance_s_*>.m_data.object,wsiType,
             native.display.
             super_UniqueBase<vk::wsi::Display,_de::DefaultDeleter<vk::wsi::Display>_>.m_data.ptr,
             native.window.super_UniqueBase<vk::wsi::Window,_de::DefaultDeleter<vk::wsi::Window>_>.
             m_data.ptr,pVVar2);
  local_268.m_data.deleter.m_instance = (VkInstance)local_288.field_2._M_allocated_capacity;
  local_268.m_data.deleter.m_allocator = (VkAllocationCallbacks *)local_288.field_2._8_8_;
  local_268.m_data.object.m_internal = (deUint64)local_288._M_dataplus._M_p;
  local_268.m_data.deleter.m_instanceIface = (InstanceInterface *)local_288._M_string_length;
  local_288._M_dataplus._M_p = (pointer)0x0;
  local_288._M_string_length = 0;
  local_288.field_2._M_allocated_capacity = 0;
  local_288.field_2._8_8_ = 0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)25>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)25>_> *)&local_288);
  bVar1 = ::vk::validateAndLog(log,&allocationRecorder,0x12);
  if (bVar1) {
    ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)25>_>::~RefBase(&local_268);
    NativeObjects::~NativeObjects(&native);
    InstanceHelper::~InstanceHelper(&instHelper);
    bVar1 = ::vk::validateAndLog(log,&allocationRecorder,0);
    if (bVar1) {
      if ((allocationRecorder.m_records.m_first == allocationRecorder.m_records.m_last) &&
         (allocationRecorder.m_records.m_numElements % allocationRecorder.m_records.m_blockSize == 0
         )) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&instHelper,"Allocation callbacks were not used",
                   (allocator<char> *)&native);
        __return_storage_ptr__->m_code = QP_TEST_RESULT_QUALITY_WARNING;
        std::__cxx11::string::string
                  ((string *)&__return_storage_ptr__->m_description,(string *)&instHelper);
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&instHelper,"Creating surface succeeded using custom allocator",
                   (allocator<char> *)&native);
        tcu::TestStatus::pass(__return_storage_ptr__,(string *)&instHelper);
      }
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&instHelper,"Detected invalid system allocation callback",
                 (allocator<char> *)&native);
      tcu::TestStatus::fail(__return_storage_ptr__,(string *)&instHelper);
    }
    std::__cxx11::string::~string((string *)&instHelper);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_288,"Detected invalid system allocation callback",&local_2a9);
    tcu::TestStatus::fail(__return_storage_ptr__,&local_288);
    std::__cxx11::string::~string((string *)&local_288);
    ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)25>_>::~RefBase(&local_268);
    NativeObjects::~NativeObjects(&native);
    InstanceHelper::~InstanceHelper(&instHelper);
  }
  ::vk::AllocationCallbackRecorder::~AllocationCallbackRecorder(&allocationRecorder);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus createSurfaceCustomAllocatorTest (Context& context, Type wsiType)
{
	AllocationCallbackRecorder	allocationRecorder	(getSystemAllocator());
	tcu::TestLog&				log					= context.getTestContext().getLog();

	{
		const InstanceHelper		instHelper	(context, wsiType, allocationRecorder.getCallbacks());
		const NativeObjects			native		(context, instHelper.supportedExtensions, wsiType);
		const Unique<VkSurfaceKHR>	surface		(createSurface(instHelper.vki,
															   *instHelper.instance,
															   wsiType,
															   *native.display,
															   *native.window,
															   allocationRecorder.getCallbacks()));

		if (!validateAndLog(log,
							allocationRecorder,
							(1u<<VK_SYSTEM_ALLOCATION_SCOPE_OBJECT)		|
							(1u<<VK_SYSTEM_ALLOCATION_SCOPE_INSTANCE)))
			return tcu::TestStatus::fail("Detected invalid system allocation callback");
	}

	if (!validateAndLog(log, allocationRecorder, 0u))
		return tcu::TestStatus::fail("Detected invalid system allocation callback");

	if (allocationRecorder.getRecordsBegin() == allocationRecorder.getRecordsEnd())
		return tcu::TestStatus(QP_TEST_RESULT_QUALITY_WARNING, "Allocation callbacks were not used");
	else
		return tcu::TestStatus::pass("Creating surface succeeded using custom allocator");
}